

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O3

void Aig_ManSeqCleanup_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  anon_union_8_2_c1dd1440_for_Aig_Obj_t__0 aVar1;
  int iVar2;
  void **ppvVar3;
  uint uVar4;
  uint uVar5;
  Aig_Obj_t **ppAVar6;
  
  iVar2 = p->nTravIds;
  if (pObj->TravId != iVar2) {
    do {
      pObj->TravId = iVar2;
      uVar4 = (uint)*(undefined8 *)&pObj->field_0x18;
      uVar5 = uVar4 & 7;
      if ((ulong)uVar5 - 3 < 2) {
        ppAVar6 = &pObj->pFanin0;
      }
      else {
        if (uVar5 == 2) {
          aVar1 = pObj->field_0;
          uVar4 = vNodes->nSize;
          if (uVar4 == vNodes->nCap) {
            if ((int)uVar4 < 0x10) {
              if (vNodes->pArray == (void **)0x0) {
                ppvVar3 = (void **)malloc(0x80);
              }
              else {
                ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
              }
              vNodes->pArray = ppvVar3;
              vNodes->nCap = 0x10;
            }
            else {
              if (vNodes->pArray == (void **)0x0) {
                ppvVar3 = (void **)malloc((ulong)uVar4 << 4);
              }
              else {
                ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar4 << 4);
              }
              vNodes->pArray = ppvVar3;
              vNodes->nCap = uVar4 * 2;
            }
          }
          else {
            ppvVar3 = vNodes->pArray;
          }
          iVar2 = vNodes->nSize;
          vNodes->nSize = iVar2 + 1;
          *(anon_union_8_2_c1dd1440_for_Aig_Obj_t__0 *)(ppvVar3 + iVar2) = aVar1;
          return;
        }
        if ((uVar4 & 7) - 7 < 0xfffffffe) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigScl.c"
                        ,0x8e,"void Aig_ManSeqCleanup_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
        }
        Aig_ManSeqCleanup_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vNodes);
        ppAVar6 = &pObj->pFanin1;
        iVar2 = p->nTravIds;
      }
      pObj = (Aig_Obj_t *)((ulong)*ppAVar6 & 0xfffffffffffffffe);
    } while (pObj->TravId != iVar2);
  }
  return;
}

Assistant:

void Aig_ManSeqCleanup_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    // collect latch input corresponding to unmarked PI (latch output)
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_PtrPush( vNodes, pObj->pNext );
        return;
    }
    if ( Aig_ObjIsCo(pObj) || Aig_ObjIsBuf(pObj) )
    {
        Aig_ManSeqCleanup_rec( p, Aig_ObjFanin0(pObj), vNodes );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    Aig_ManSeqCleanup_rec( p, Aig_ObjFanin0(pObj), vNodes );
    Aig_ManSeqCleanup_rec( p, Aig_ObjFanin1(pObj), vNodes );
}